

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Initialize(void)

{
  int *piVar1;
  ImGuiViewportP **ppIVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiID IVar6;
  long lVar7;
  ImGuiViewportP *pIVar8;
  ImGuiViewportP **__dest;
  char *__dest_00;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ImGuiSettingsHandler ini_handler;
  ImGuiSettingsHandler local_68;
  
  pIVar4 = GImGui;
  local_68.TypeHash = 0;
  local_68._12_4_ = 0;
  local_68.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_68.WriteAllFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
  local_68.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
  local_68.ReadLineFn =
       (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
  local_68.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_68.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
  local_68.UserData = (void *)0x0;
  local_68.TypeName = "Window";
  IVar6 = ImHashStr("Window",0,0);
  local_68.TypeHash = IVar6;
  local_68.ClearAllFn = WindowSettingsHandler_ClearAll;
  local_68.ReadOpenFn = WindowSettingsHandler_ReadOpen;
  local_68.ReadLineFn = WindowSettingsHandler_ReadLine;
  local_68.ApplyAllFn = WindowSettingsHandler_ApplyAll;
  local_68.WriteAllFn = WindowSettingsHandler_WriteAll;
  AddSettingsHandler(&local_68);
  TableSettingsAddSettingsHandler();
  pIVar5 = GImGui;
  lVar7 = 8;
  do {
    pIVar5->LocalizationTable[*(int *)(&UNK_002c34d8 + lVar7)] =
         *(char **)((long)&GLocalizationEntriesEnUS[0].Key + lVar7);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x78);
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  pIVar8 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0xb8,GImAllocatorUserData);
  (pIVar8->super_ImGuiViewport).WorkPos.x = 0.0;
  (pIVar8->super_ImGuiViewport).WorkPos.y = 0.0;
  (pIVar8->super_ImGuiViewport).WorkSize.x = 0.0;
  (pIVar8->super_ImGuiViewport).WorkSize.y = 0.0;
  (pIVar8->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar8->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar8->super_ImGuiViewport).Size.x = 0.0;
  (pIVar8->super_ImGuiViewport).Size.y = 0.0;
  *(undefined8 *)&(pIVar8->super_ImGuiViewport).Size.y = 0;
  *(undefined8 *)&(pIVar8->super_ImGuiViewport).WorkPos.y = 0;
  *(undefined8 *)&(pIVar8->super_ImGuiViewport).WorkSize.y = 0;
  (pIVar8->super_ImGuiViewport).PlatformHandleRaw = (void *)0x0;
  (pIVar8->super_ImGuiViewport).Flags = 0;
  (pIVar8->super_ImGuiViewport).Pos.x = 0.0;
  *(undefined8 *)&(pIVar8->super_ImGuiViewport).Pos.y = 0;
  (pIVar8->DrawDataP).DisplayPos.x = 0.0;
  (pIVar8->DrawDataP).DisplayPos.y = 0.0;
  (pIVar8->DrawDataP).DisplaySize.x = 0.0;
  (pIVar8->DrawDataP).DisplaySize.y = 0.0;
  (pIVar8->DrawDataP).FramebufferScale.x = 0.0;
  (pIVar8->DrawDataP).FramebufferScale.y = 0.0;
  (pIVar8->DrawDataP).Valid = false;
  *(undefined3 *)&(pIVar8->DrawDataP).field_0x1 = 0;
  (pIVar8->DrawDataP).CmdListsCount = 0;
  (pIVar8->DrawDataP).TotalIdxCount = 0;
  (pIVar8->DrawDataP).TotalVtxCount = 0;
  (pIVar8->DrawDataP).DisplaySize.x = 0.0;
  (pIVar8->DrawDataP).DisplaySize.y = 0.0;
  (pIVar8->DrawDataP).FramebufferScale.x = 0.0;
  (pIVar8->DrawDataP).FramebufferScale.y = 0.0;
  (pIVar8->DrawDataP).CmdLists = (ImDrawList **)0x0;
  (pIVar8->DrawDataP).DisplayPos.x = 0.0;
  (pIVar8->DrawDataP).DisplayPos.y = 0.0;
  (pIVar8->DrawDataBuilder).Layers[0].Size = 0;
  (pIVar8->DrawDataBuilder).Layers[0].Capacity = 0;
  (pIVar8->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
  (pIVar8->DrawDataBuilder).Layers[1].Size = 0;
  (pIVar8->DrawDataBuilder).Layers[1].Capacity = 0;
  (pIVar8->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
  (pIVar8->WorkOffsetMin).x = 0.0;
  (pIVar8->WorkOffsetMin).y = 0.0;
  (pIVar8->WorkOffsetMax).x = 0.0;
  (pIVar8->WorkOffsetMax).y = 0.0;
  (pIVar8->BuildWorkOffsetMin).x = 0.0;
  (pIVar8->BuildWorkOffsetMin).y = 0.0;
  (pIVar8->BuildWorkOffsetMax).x = 0.0;
  (pIVar8->BuildWorkOffsetMax).y = 0.0;
  pIVar8->DrawListsLastFrame[0] = -1;
  pIVar8->DrawListsLastFrame[1] = -1;
  pIVar8->DrawLists[0] = (ImDrawList *)0x0;
  pIVar8->DrawLists[1] = (ImDrawList *)0x0;
  iVar12 = (pIVar4->Viewports).Size;
  iVar10 = (pIVar4->Viewports).Capacity;
  if (iVar12 == iVar10) {
    iVar12 = iVar12 + 1;
    if (iVar10 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar10 / 2 + iVar10;
    }
    if (iVar12 < iVar9) {
      iVar12 = iVar9;
    }
    if (iVar10 < iVar12) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar12 << 3,GImAllocatorUserData);
      ppIVar2 = (pIVar4->Viewports).Data;
      if (ppIVar2 != (ImGuiViewportP **)0x0) {
        memcpy(__dest,ppIVar2,(long)(pIVar4->Viewports).Size << 3);
        ppIVar2 = (pIVar4->Viewports).Data;
        if ((ppIVar2 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
      }
      (pIVar4->Viewports).Data = __dest;
      (pIVar4->Viewports).Capacity = iVar12;
    }
  }
  (pIVar4->Viewports).Data[(pIVar4->Viewports).Size] = pIVar8;
  (pIVar4->Viewports).Size = (pIVar4->Viewports).Size + 1;
  iVar12 = (pIVar4->TempBuffer).Capacity;
  if (iVar12 < 0xc01) {
    if (iVar12 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar12 / 2 + iVar12;
    }
    iVar9 = 0xc01;
    if (0xc01 < iVar10) {
      iVar9 = iVar10;
    }
    if (iVar12 < iVar9) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest_00 = (char *)(*GImAllocatorAllocFunc)((size_t)iVar9,GImAllocatorUserData);
      pcVar3 = (pIVar4->TempBuffer).Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(__dest_00,pcVar3,(long)(pIVar4->TempBuffer).Size);
        pcVar3 = (pIVar4->TempBuffer).Data;
        if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
      }
      (pIVar4->TempBuffer).Data = __dest_00;
      (pIVar4->TempBuffer).Capacity = iVar9;
    }
  }
  lVar7 = (long)(pIVar4->TempBuffer).Size;
  if (lVar7 < 0xc01) {
    do {
      lVar11 = lVar7 + 1;
      (pIVar4->TempBuffer).Data[lVar7] = '\0';
      lVar7 = lVar11;
    } while ((int)lVar11 != 0xc01);
  }
  (pIVar4->TempBuffer).Size = 0xc01;
  pIVar4->Initialized = true;
  return;
}

Assistant:

void ImGui::Initialize()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow and ImGuiTable types
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        AddSettingsHandler(&ini_handler);
    }
    TableSettingsAddSettingsHandler();

    // Setup default localization table
    LocalizeRegisterEntries(GLocalizationEntriesEnUS, IM_ARRAYSIZE(GLocalizationEntriesEnUS));

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);
    g.TempBuffer.resize(1024 * 3 + 1, 0);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}